

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doGetUsedFuncs(Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *this,FuncSet *dst)

{
  Expr<tcu::Vector<float,_2>_> *pEVar1;
  Expr<float> *pEVar2;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar3;
  
  (**(code **)(*(long *)this->m_func + 0x38))();
  pEVar1 = (this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
           m_ptr;
  (*(pEVar1->super_ExprBase)._vptr_ExprBase[3])(pEVar1,dst);
  pEVar2 = (this->m_args).b.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  pEVar3 = (this->m_args).c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[3])(pEVar3,dst);
  pEVar3 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[3])(pEVar3,dst);
  return;
}

Assistant:

void				doGetUsedFuncs	(FuncSet& dst) const
	{
		m_func.getUsedFuncs(dst);
		m_args.a->getUsedFuncs(dst);
		m_args.b->getUsedFuncs(dst);
		m_args.c->getUsedFuncs(dst);
		m_args.d->getUsedFuncs(dst);
	}